

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O0

lzma_ret lzma_lzma_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  _Bool _Var1;
  uint32_t uVar2;
  lzma_options_lzma *options_00;
  lzma_options_lzma *opt;
  size_t props_size_local;
  uint8_t *props_local;
  lzma_allocator *allocator_local;
  void **options_local;
  
  if (props_size == 5) {
    options_00 = (lzma_options_lzma *)lzma_alloc(0x70,allocator);
    if (options_00 == (lzma_options_lzma *)0x0) {
      options_local._4_4_ = LZMA_MEM_ERROR;
    }
    else {
      _Var1 = lzma_lzma_lclppb_decode(options_00,*props);
      if (_Var1) {
        lzma_free(options_00,allocator);
        options_local._4_4_ = LZMA_OPTIONS_ERROR;
      }
      else {
        uVar2 = read32le(props + 1);
        options_00->dict_size = uVar2;
        options_00->preset_dict = (uint8_t *)0x0;
        options_00->preset_dict_size = 0;
        *options = options_00;
        options_local._4_4_ = LZMA_OK;
      }
    }
  }
  else {
    options_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return options_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lzma_props_decode(void **options, const lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	if (props_size != 5)
		return LZMA_OPTIONS_ERROR;

	lzma_options_lzma *opt
			= lzma_alloc(sizeof(lzma_options_lzma), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	if (lzma_lzma_lclppb_decode(opt, props[0]))
		goto error;

	// All dictionary sizes are accepted, including zero. LZ decoder
	// will automatically use a dictionary at least a few KiB even if
	// a smaller dictionary is requested.
	opt->dict_size = read32le(props + 1);

	opt->preset_dict = NULL;
	opt->preset_dict_size = 0;

	*options = opt;

	return LZMA_OK;

error:
	lzma_free(opt, allocator);
	return LZMA_OPTIONS_ERROR;
}